

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_header_table_detach(lws *wsi,int autoservice)

{
  lws **pplVar1;
  int *piVar2;
  char cVar3;
  lws_context *plVar4;
  allocated_headers *ah;
  lws **pplVar5;
  int iVar6;
  char *pcVar7;
  lws **pplVar8;
  lws *plVar9;
  lws **pplVar10;
  int iStack_50;
  undefined4 uStack_4c;
  lws **pplStack_48;
  lws_pollargs lStack_3c;
  
  plVar4 = (wsi->a).context;
  ah = (wsi->http).ah;
  cVar3 = wsi->tsi;
  __lws_remove_from_ah_waiting_list(wsi);
  if (ah == (allocated_headers *)0x0) {
    return 0;
  }
  pcVar7 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: ah %p (tsi=%d, count = %d)\n","__lws_header_table_detach",pcVar7,ah,
           (ulong)(uint)(int)wsi->tsi,
           *(undefined4 *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x78));
  time((time_t *)&iStack_50);
  if ((ah->assigned != 0) && (3 < CONCAT44(uStack_4c,iStack_50) - ah->assigned)) {
    pcVar7 = lws_wsi_tag(wsi);
    _lws_log(0x10,"%s: %s: ah held %ds, role/state 0x%lx 0x%x,\n","__lws_header_table_detach",pcVar7
             ,(ulong)(uint)(iStack_50 - (int)ah->assigned),(ulong)(wsi->wsistate & 0xffff0000),
             wsi->wsistate & 0xffff);
  }
  ah->assigned = 0;
  if (*(int *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x78) < 1) {
    __assert_fail("pt->http.ah_count_in_use > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x154,"int __lws_header_table_detach(struct lws *, int)");
  }
  if (ah->in_use == '\0') {
    __assert_fail("ah->in_use",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x156,"int __lws_header_table_detach(struct lws *, int)");
  }
  ah->wsi = (lws *)0x0;
  (wsi->http).ah = (allocated_headers *)0x0;
  plVar9 = plVar4->pt[cVar3].http.ah_wait_list;
  if (plVar9 != (lws *)0x0) {
    pplVar1 = &plVar4->pt[cVar3].http.ah_wait_list;
    pcVar7 = lws_wsi_tag(plVar9);
    _lws_log(8,"%s: pt wait list %s\n","__lws_header_table_detach",pcVar7);
    pplVar5 = (lws **)0x0;
    pplVar10 = pplVar1;
    plVar9 = (lws *)0x0;
    do {
      wsi = plVar9;
      pplVar8 = pplVar5;
      plVar9 = *pplVar10;
      pplVar5 = pplVar10;
      pplVar10 = &(plVar9->http).ah_wait_list;
    } while (plVar9 != (lws *)0x0);
    pplStack_48 = pplVar1;
    if (wsi != (lws *)0x0) {
      pcVar7 = lws_wsi_tag(wsi);
      _lws_log(8,"%s: transferring ah to last eligible wsi in wait list %s (wsistate 0x%lx)\n",
               "__lws_header_table_detach",pcVar7,(ulong)wsi->wsistate);
      (wsi->http).ah = ah;
      ah->wsi = wsi;
      __lws_header_table_reset(wsi,autoservice);
      if (wsi->position_in_fds_table != -1) {
        pcVar7 = lws_wsi_tag(wsi);
        _lws_log(8,"%s: Enabling %s POLLIN\n","__lws_header_table_detach",pcVar7);
        _lws_change_pollfd(wsi,0,1,&lStack_3c);
      }
      *pplVar8 = (wsi->http).ah_wait_list;
      (wsi->http).ah_wait_list = (lws *)0x0;
      iVar6 = *(int *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x80) + -1;
      *(int *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x80) = iVar6;
      if ((wsi->wsistate & 0x1000ffff) == 0x10000200) {
        plVar9 = lws_http_client_connect_via_info2(wsi);
        return -(uint)(plVar9 == (lws *)0x0);
      }
      if ((*pplStack_48 == (lws *)0x0) == (iVar6 != 0)) {
        __assert_fail("!!pt->http.ah_wait_list_length == !!(lws_intptr_t)pt->http.ah_wait_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                      ,0x1ae,"int __lws_header_table_detach(struct lws *, int)");
      }
      goto LAB_0011c4bf;
    }
    wsi = (lws *)0x0;
  }
  _lws_log(8,"%s: nobody usable waiting\n","__lws_header_table_detach");
  _lws_destroy_ah(plVar4->pt + cVar3,ah);
  piVar2 = (int *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x78);
  *piVar2 = *piVar2 + -1;
LAB_0011c4bf:
  pcVar7 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: ah %p (tsi=%d, count = %d)\n","__lws_header_table_detach",pcVar7,ah,
           (ulong)*(byte *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x4e),
           *(undefined4 *)((long)plVar4->lcg + (long)cVar3 * 0x1a0 + -0x78));
  return 0;
}

Assistant:

int lws_header_table_detach(struct lws *wsi, int autoservice)
{
	struct lws_context *context = wsi->a.context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n;

	lws_pt_lock(pt, __func__);
	n = __lws_header_table_detach(wsi, autoservice);
	lws_pt_unlock(pt);

	return n;
}